

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall DMovePoly::Tick(DMovePoly *this)

{
  bool bVar1;
  FPolyObj *this_00;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  TAngle<double> local_28;
  double dStack_20;
  
  this_00 = PO_GetPolyobj((this->super_DPolyAction).m_PolyObj);
  if (this_00 != (FPolyObj *)0x0) {
    bVar1 = FPolyObj::MovePolyobj(this_00,&this->m_Speedv,false);
    if (bVar1) {
      dVar3 = (this->super_DPolyAction).m_Speed;
      dVar5 = ABS(dVar3);
      dVar4 = (this->super_DPolyAction).m_Dist - dVar5;
      (this->super_DPolyAction).m_Dist = dVar4;
      if (dVar4 <= 0.0) {
        SN_StopSequence(this_00);
        (*(this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject[4])(this);
      }
      else if (dVar4 < dVar5) {
        uVar2 = -(ulong)(dVar3 < 0.0);
        dVar3 = (double)(~uVar2 & (ulong)dVar4 | (ulong)-dVar4 & uVar2);
        (this->super_DPolyAction).m_Speed = dVar3;
        TAngle<double>::ToVector(&local_28,dVar3);
        (this->m_Speedv).X = local_28.Degrees;
        (this->m_Speedv).Y = dStack_20;
      }
      FPolyObj::UpdateLinks(this_00);
    }
  }
  return;
}

Assistant:

void DMovePoly::Tick ()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);

	if (poly != NULL)
	{
		if (poly->MovePolyobj (m_Speedv))
		{
			double absSpeed = fabs (m_Speed);
			m_Dist -= absSpeed;
			if (m_Dist <= 0)
			{
				SN_StopSequence (poly);
				Destroy ();
			}
			else if (m_Dist < absSpeed)
			{
				m_Speed = m_Dist * (m_Speed < 0 ? -1 : 1);
				m_Speedv = m_Angle.ToVector(m_Speed);
			}
			poly->UpdateLinks();
		}
	}
}